

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O2

void __thiscall TasGrid::CustomTabulated::read<false>(CustomTabulated *this,istream *is)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  pointer pvVar1;
  pointer pdVar2;
  int iVar3;
  istream *this_02;
  istream *piVar4;
  invalid_argument *this_03;
  double *w;
  long lVar5;
  pointer pdVar6;
  int i;
  long lVar7;
  char dummy;
  string T;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  T._M_dataplus._M_p = (pointer)&T.field_2;
  T._M_string_length = 0;
  T.field_2._M_local_buf[0] = '\0';
  ::std::operator>>(is,(string *)&T);
  iVar3 = ::std::__cxx11::string::compare((char *)&T);
  if (iVar3 == 0) {
    ::std::istream::get((char *)is);
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    ::std::__cxx11::string::operator=((string *)&this->description,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::getline<char,std::char_traits<char>,std::allocator<char>>
              (is,(string *)&this->description);
    ::std::operator>>(is,(string *)&T);
    iVar3 = ::std::__cxx11::string::compare((char *)&T);
    if (iVar3 == 0) {
      ::std::istream::operator>>((istream *)is,&this->num_levels);
      this_00 = &this->num_nodes;
      ::std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->num_levels);
      ::std::vector<int,_std::allocator<int>_>::resize(&this->precision,(long)this->num_levels);
      lVar5 = 0;
      for (lVar7 = 0; lVar7 < this->num_levels; lVar7 = lVar7 + 1) {
        this_02 = (istream *)
                  ::std::istream::operator>>
                            ((istream *)is,
                             (int *)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar5));
        ::std::istream::operator>>
                  (this_02,(int *)((long)(this->precision).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 4;
      }
      ::std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&this->nodes,(long)this->num_levels);
      this_01 = &this->weights;
      ::std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_01,(long)this->num_levels);
      for (lVar5 = 0; lVar5 < this->num_levels; lVar5 = lVar5 + 1) {
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((this->nodes).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar5,
                   (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar5]);
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((this_01->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar5,
                   (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar5]);
        pvVar1 = (this_01->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar2 = *(pointer *)
                  ((long)&pvVar1[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (pdVar6 = pvVar1[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start; pdVar6 != pdVar2; pdVar6 = pdVar6 + 1) {
          piVar4 = ::std::istream::_M_extract<double>((double *)is);
          ::std::istream::_M_extract<double>((double *)piVar4);
        }
      }
      ::std::__cxx11::string::~string((string *)&T);
      return;
    }
    this_03 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_03,"ERROR: wrong file format of custom tables on line 2");
  }
  else {
    this_03 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_03,"ERROR: wrong file format of custom tables on line 1");
  }
  __cxa_throw(this_03,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void CustomTabulated::read(std::istream &is){
    if (iomode == mode_ascii){ // messy format chosen for better human readability, hard to template and generalize
        std::string T;
        char dummy;
        is >> T;
        if (!(T.compare("description:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 1"); }
        is.get(dummy);
        description = std::string();
        getline(is, description);

        is >> T;
        if (!(T.compare("levels:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 2"); }
        is >> num_levels;

        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        for(int i=0; i<num_levels; i++)
            is >> num_nodes[i] >> precision[i];

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            auto x = nodes[l].begin();
            for(auto &w : weights[l]) is >> w >> *x++;
        }
    }else{
        int num_description = 0;
        is.read((char*) &num_description, sizeof(int));
        std::vector<char> desc((size_t) num_description+1);
        is.read(desc.data(), num_description);
        desc[num_description] = '\0';
        description = desc.data();

        is.read((char*) &num_levels, sizeof(int));
        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        is.read((char*) num_nodes.data(), num_levels * sizeof(int));
        is.read((char*) precision.data(), num_levels * sizeof(int));

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            is.read((char*) weights[l].data(), num_nodes[l] * sizeof(double));
            is.read((char*) nodes[l].data(), num_nodes[l] * sizeof(double));
        }
    }
}